

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astIfNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  ulong uVar2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  anon_struct_56_7_8f908ccc gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 7;
  puStack_30 = (undefined1 *)&local_98;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_98 = sysbvm_context_shallowCopy(context,*arguments);
  sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x18) = sVar4;
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(local_98 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  sStack_90 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_98 + 0x28),(context->roots).booleanType,
                         arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x28) = sStack_90;
  if (*(sysbvm_tuple_t *)(local_98 + 0x30) != 0) {
    local_88 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_98 + 0x30),arguments[1]);
    *(sysbvm_tuple_t *)(local_98 + 0x30) = local_88;
  }
  if (*(sysbvm_tuple_t *)(local_98 + 0x38) != 0) {
    local_78 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_98 + 0x38),arguments[1]);
    *(sysbvm_tuple_t *)(local_98 + 0x38) = local_78;
  }
  _Var3 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_98 + 0x28));
  if (_Var3) {
    sVar4 = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(local_98 + 0x28));
    local_68 = *(sysbvm_tuple_t *)(local_98 + 0x30 + (ulong)(sVar4 != 0x1f) * 8);
    if (local_68 == 0) {
      local_68 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_98 + 0x10),0x2f);
    }
    sysbvm_stackFrame_popRecord(&local_60);
    sysbvm_stackFrame_popRecord(&local_48);
  }
  else {
    *(sysbvm_tuple_t *)(local_98 + 0x20) = (context->roots).anyValueType;
    if (local_78 == 0 || local_88 == 0) {
      if ((*(long *)(local_98 + 0x30) == 0) || (*(long *)(local_98 + 0x38) == 0)) {
        *(sysbvm_tuple_t *)(local_98 + 0x20) = (context->roots).voidType;
      }
    }
    else {
      if ((local_88 & 0xf) == 0) {
        sStack_80 = *(sysbvm_tuple_t *)(local_88 + 0x20);
      }
      else {
        sStack_80 = 0;
      }
      if ((local_78 & 0xf) == 0) {
        sStack_70 = *(sysbvm_tuple_t *)(local_78 + 0x20);
      }
      else {
        sStack_70 = 0;
      }
      uVar2 = (context->roots).controlFlowEscapeType;
      bVar6 = (uVar2 & 0xf) == 0;
      if (((bVar6 && uVar2 != 0) && ((sStack_80 & 0xf) == 0 && sStack_80 != 0)) &&
         (uVar5 = sStack_80, (*(byte *)(sStack_80 + 8) & 0x80) == 0)) {
        do {
          bVar7 = uVar5 == uVar2;
          if (bVar7) goto LAB_0011f578;
          puVar1 = (ulong *)(uVar5 + 0x30);
          uVar5 = *puVar1;
        } while (*puVar1 != 0);
      }
      bVar7 = false;
LAB_0011f578:
      sVar4 = (context->roots).undefinedObjectType;
      if (((bVar6 && uVar2 != 0) && ((sStack_70 & 0xf) == 0 && sStack_70 != 0)) &&
         (uVar5 = sStack_70, (*(byte *)(sStack_70 + 8) & 0x80) == 0)) {
        do {
          bVar6 = uVar5 == uVar2;
          if (bVar6) goto LAB_0011f5b6;
          puVar1 = (ulong *)(uVar5 + 0x30);
          uVar5 = *puVar1;
        } while (*puVar1 != 0);
      }
      bVar6 = false;
LAB_0011f5b6:
      if ((bool)(bVar7 | sStack_80 == sVar4)) {
        *(sysbvm_tuple_t *)(local_98 + 0x20) = sStack_70;
      }
      else if ((bool)(bVar6 | sStack_70 == sVar4)) {
        *(sysbvm_tuple_t *)(local_98 + 0x20) = sStack_80;
      }
      else {
        sVar4 = sysbvm_type_computeLCA(sStack_80,sStack_70);
        *(sysbvm_tuple_t *)(local_98 + 0x20) = sVar4;
        if (sVar4 == 0) {
          *(sysbvm_tuple_t *)(local_98 + 0x20) = (context->roots).anyValueType;
        }
      }
    }
    sysbvm_stackFrame_popRecord(&local_60);
    sysbvm_stackFrame_popRecord(&local_48);
    local_68 = local_98;
  }
  return local_68;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIfNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astIfNode_t *ifNode;
        sysbvm_tuple_t analyzedCondition;
        sysbvm_tuple_t analyzedTrueExpression;
        sysbvm_tuple_t analyzedTrueExpressionType;
        sysbvm_tuple_t analyzedFalseExpression;
        sysbvm_tuple_t analyzedFalseExpressionType;

        sysbvm_tuple_t analyzedTakenBranch;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.ifNode = (sysbvm_astIfNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.ifNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.ifNode->super.sourcePosition);

    gcFrame.analyzedCondition = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.ifNode->conditionExpression, context->roots.booleanType, *environment);
    gcFrame.ifNode->conditionExpression = gcFrame.analyzedCondition;
    if(gcFrame.ifNode->trueExpression)
    {
        gcFrame.analyzedTrueExpression = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.ifNode->trueExpression, *environment);
        gcFrame.ifNode->trueExpression = gcFrame.analyzedTrueExpression;
    }
    if(gcFrame.ifNode->falseExpression)
    {
        gcFrame.analyzedFalseExpression = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.ifNode->falseExpression, *environment);
        gcFrame.ifNode->falseExpression = gcFrame.analyzedFalseExpression;
    }

    if(sysbvm_astNode_isLiteralNode(context, gcFrame.ifNode->conditionExpression))
    {
        bool conditionValue = sysbvm_tuple_boolean_decode(sysbvm_astLiteralNode_getValue(gcFrame.ifNode->conditionExpression));
        gcFrame.analyzedTakenBranch = conditionValue ? gcFrame.ifNode->trueExpression : gcFrame.ifNode->falseExpression;
        if(!gcFrame.analyzedTakenBranch)
            gcFrame.analyzedTakenBranch = sysbvm_astLiteralNode_create(context, gcFrame.ifNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
        
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedTakenBranch;
    }

    // Require the same, otherwise fallback to void.
    gcFrame.ifNode->super.analyzedType = context->roots.anyValueType;
    if(gcFrame.analyzedTrueExpression && gcFrame.analyzedFalseExpression)
    {
        gcFrame.analyzedTrueExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTrueExpression);
        gcFrame.analyzedFalseExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedFalseExpression);
        bool trueExpressionIsControlFlowEscape = sysbvm_type_isDirectSubtypeOf(gcFrame.analyzedTrueExpressionType, context->roots.controlFlowEscapeType);
        bool trueExpressionIsUndefinedType = gcFrame.analyzedTrueExpressionType == context->roots.undefinedObjectType;

        bool falseExpressionIsControlFlowEscape = sysbvm_type_isDirectSubtypeOf(gcFrame.analyzedFalseExpressionType, context->roots.controlFlowEscapeType);
        bool falseExpressionIsUndefinedType = gcFrame.analyzedFalseExpressionType == context->roots.undefinedObjectType;

        if(trueExpressionIsControlFlowEscape || trueExpressionIsUndefinedType)
        {
            gcFrame.ifNode->super.analyzedType = gcFrame.analyzedFalseExpressionType;
        }
        else if(falseExpressionIsControlFlowEscape || falseExpressionIsUndefinedType)
        {
            gcFrame.ifNode->super.analyzedType = gcFrame.analyzedTrueExpressionType;
        }
        else
        {
            gcFrame.ifNode->super.analyzedType = sysbvm_type_computeLCA(gcFrame.analyzedTrueExpressionType, gcFrame.analyzedFalseExpressionType);
            if(!gcFrame.ifNode->super.analyzedType)
                gcFrame.ifNode->super.analyzedType = context->roots.anyValueType;
        }
    }
    else if(!gcFrame.ifNode->trueExpression || !gcFrame.ifNode->falseExpression)
    {
        gcFrame.ifNode->super.analyzedType = context->roots.voidType;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.ifNode;
}